

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzma2_decoder.c
# Opt level: O3

lzma_ret lzma_lzma2_props_decode
                   (void **options,lzma_allocator *allocator,uint8_t *props,size_t props_size)

{
  byte bVar1;
  lzma_ret lVar2;
  int *piVar3;
  int iVar4;
  
  lVar2 = LZMA_OPTIONS_ERROR;
  if ((props_size == 1) && (lVar2 = LZMA_OPTIONS_ERROR, *props < 0x29)) {
    piVar3 = (int *)lzma_alloc(0x70,allocator);
    if (piVar3 == (int *)0x0) {
      lVar2 = LZMA_MEM_ERROR;
    }
    else {
      bVar1 = *props;
      iVar4 = -1;
      if (bVar1 != 0x28) {
        iVar4 = (bVar1 & 1 | 2) << ((bVar1 >> 1) + 0xb & 0x1f);
      }
      *piVar3 = iVar4;
      piVar3[2] = 0;
      piVar3[3] = 0;
      piVar3[4] = 0;
      *options = piVar3;
      lVar2 = LZMA_OK;
    }
  }
  return lVar2;
}

Assistant:

extern lzma_ret
lzma_lzma2_props_decode(void **options, lzma_allocator *allocator,
		const uint8_t *props, size_t props_size)
{
	lzma_options_lzma *opt;

	if (props_size != 1)
		return LZMA_OPTIONS_ERROR;

	// Check that reserved bits are unset.
	if (props[0] & 0xC0)
		return LZMA_OPTIONS_ERROR;

	// Decode the dictionary size.
	if (props[0] > 40)
		return LZMA_OPTIONS_ERROR;

	opt = lzma_alloc(sizeof(lzma_options_lzma), allocator);
	if (opt == NULL)
		return LZMA_MEM_ERROR;

	if (props[0] == 40) {
		opt->dict_size = UINT32_MAX;
	} else {
		opt->dict_size = 2 | (props[0] & 1);
		opt->dict_size <<= props[0] / 2 + 11;
	}

	opt->preset_dict = NULL;
	opt->preset_dict_size = 0;

	*options = opt;

	return LZMA_OK;
}